

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch_param.c
# Opt level: O2

int getEvent(void *ptr,mpt_event *ev)

{
  mpt_message *pmVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  mpt_reply_context *rc;
  mpt_config *cfg;
  mpt_message tmp;
  
  if (ev == (mpt_event *)0x0) {
    if (ptr == (void *)0x0) {
      return 0;
    }
    (**(code **)(*ptr + 8))(ptr);
    return 0;
  }
  pmVar1 = ev->msg;
  if (pmVar1 == (mpt_message *)0x0) {
    rc = ev->reply;
    pcVar4 = "no default config query";
    iVar2 = -0x10;
  }
  else {
    tmp.used = pmVar1->used;
    tmp.base = pmVar1->base;
    tmp.cont = pmVar1->cont;
    tmp.clen = pmVar1->clen;
    iVar2 = getArg(&tmp,5,"mpt_dispatch_param.get");
    if (iVar2 < 0) {
      return iVar2;
    }
    cfg = (mpt_config *)0x0;
    if ((ptr == (void *)0x0) ||
       (iVar3 = (*(code *)**ptr)(ptr,0x85,&cfg), -1 < iVar3 && cfg != (mpt_config *)0x0)) {
      if (ev->reply == (mpt_reply_context *)0x0) {
        mpt_context_reply((mpt_reply_context *)0x0,1,"no event reply context");
        return 0;
      }
      iVar2 = mpt_config_reply(ev->reply,cfg,iVar2,&tmp);
      if (-1 < iVar2) {
        return 0;
      }
      rc = ev->reply;
      pcVar4 = "failed to get config elements";
    }
    else {
      rc = ev->reply;
      pcVar4 = "bad config";
      iVar2 = -2;
    }
  }
  mpt_context_reply(rc,iVar2,"%s",pcVar4);
  ev->id = 0;
  return 3;
}

Assistant:

static int getEvent(void *ptr, MPT_STRUCT(event) *ev)
{
	static const char _func[] = "mpt_dispatch_param.get";
	MPT_INTERFACE(metatype) *conf = ptr;
	MPT_INTERFACE(config) *cfg;
	MPT_STRUCT(message) tmp;
	
	int ret;
	
	if (!ev) {
		if (conf) {
			conf->_vptr->unref(conf);
		}
		return 0;
	}
	if (!ev->msg) {
		return MPT_event_fail(ev, MPT_ERROR(MissingData), MPT_tr("no default config query"));
	}
	tmp = *ev->msg;
	if ((ret = getArg(&tmp, MPT_MESGTYPE(ParamGet), _func)) < 0) {
		return ret;
	}
	cfg = 0;
	if (conf) {
		if (MPT_metatype_convert(conf, MPT_ENUM(TypeConfigPtr), &cfg) < 0
		    || !cfg) {
			return MPT_event_fail(ev, MPT_ERROR(BadValue), MPT_tr("bad config"));
		}
	}
	if (!ev->reply) {
		mpt_context_reply(0, 1, MPT_tr("no event reply context"));
		return MPT_EVENTFLAG(None);
	}
	ret = mpt_config_reply(ev->reply, cfg, ret, &tmp);
	if (ret < 0) {
		return MPT_event_fail(ev, ret, MPT_tr("failed to get config elements"));
	}
	return MPT_EVENTFLAG(None);
}